

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::FiberPool::runSynchronously(FiberPool *this,FunctionParam<void_()> func)

{
  FiberStack *pFVar1;
  Exception *pEVar2;
  Exception *e;
  Exception *_e722;
  undefined1 local_1d8 [8];
  Own<kj::_::FiberStack,_std::nullptr_t> stack;
  undefined1 local_1c0 [8];
  SynchronousFunc syncFunc;
  FiberPool *this_local;
  FunctionParam<void_()> func_local;
  
  func_local.space._0_8_ = func.space._8_8_;
  this_local = func.space._0_8_;
  syncFunc.exception.ptr.field_1.value.details.builder.disposer = (ArrayDisposer *)this;
  anon_unknown_173::ensureThreadCanRunFibers();
  local_1c0 = (undefined1  [8])&this_local;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&syncFunc);
  Own<kj::FiberPool::Impl,_std::nullptr_t>::operator->(&this->impl);
  Impl::takeStack((Impl *)local_1d8);
  pFVar1 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->
                     ((Own<kj::_::FiberStack,_std::nullptr_t> *)local_1d8);
  kj::_::FiberStack::initialize(pFVar1,(SynchronousFunc *)local_1c0);
  pFVar1 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->
                     ((Own<kj::_::FiberStack,_std::nullptr_t> *)local_1d8);
  kj::_::FiberStack::switchToFiber(pFVar1);
  pFVar1 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->
                     ((Own<kj::_::FiberStack,_std::nullptr_t> *)local_1d8);
  kj::_::FiberStack::reset(pFVar1);
  Own<kj::_::FiberStack,_std::nullptr_t>::~Own((Own<kj::_::FiberStack,_std::nullptr_t> *)local_1d8);
  pEVar2 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)&syncFunc);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwRecoverableException(pEVar2,0);
  }
  kj::_::FiberStack::SynchronousFunc::~SynchronousFunc((SynchronousFunc *)local_1c0);
  return;
}

Assistant:

void FiberPool::runSynchronously(kj::FunctionParam<void()> func) const {
  ensureThreadCanRunFibers();

  _::FiberStack::SynchronousFunc syncFunc { func, kj::none };

  {
    auto stack = impl->takeStack();
    stack->initialize(syncFunc);
    stack->switchToFiber();
    stack->reset();  // safe to reuse
  }

  KJ_IF_SOME(e, syncFunc.exception) {
    kj::throwRecoverableException(kj::mv(e));
  }
}